

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neverbleed.c
# Opt level: O2

int neverbleed_setuidgid(neverbleed_t *nb,char *user,int change_socket_ownership)

{
  int iVar1;
  st_neverbleed_thread_data_t *psVar2;
  int *piVar3;
  char *fmt;
  expbuf_t buf;
  expbuf_t local_48;
  
  psVar2 = get_thread_data(nb);
  local_48.end = (char *)0x0;
  local_48.capacity = 0;
  local_48.buf = (char *)0x0;
  local_48.start = (char *)0x0;
  expbuf_push_str(&local_48,"setuidgid");
  expbuf_push_str(&local_48,user);
  expbuf_push_num(&local_48,(long)change_socket_ownership);
  iVar1 = expbuf_write(&local_48,psVar2->fd);
  if (iVar1 == 0) {
    expbuf_dispose(&local_48);
    iVar1 = expbuf_read(&local_48,psVar2->fd);
    if (iVar1 == 0) {
      if (7 < (ulong)((long)local_48.end - (long)local_48.start)) {
        iVar1 = *(int *)local_48.start;
        local_48.start = (char *)((long)local_48.start + 8);
        expbuf_dispose(&local_48);
        return iVar1;
      }
      piVar3 = __errno_location();
      *piVar3 = 0;
      fmt = "failed to parse response";
      goto LAB_00182408;
    }
    piVar3 = __errno_location();
    iVar1 = *piVar3;
    fmt = "read error";
  }
  else {
    piVar3 = __errno_location();
    iVar1 = *piVar3;
    fmt = "write error";
  }
  if (iVar1 == 0) {
    fmt = "connection closed by daemon";
  }
LAB_00182408:
  dief(fmt);
}

Assistant:

int neverbleed_setuidgid(neverbleed_t *nb, const char *user, int change_socket_ownership)
{
    struct st_neverbleed_thread_data_t *thdata = get_thread_data(nb);
    struct expbuf_t buf = {NULL};
    size_t ret;

    expbuf_push_str(&buf, "setuidgid");
    expbuf_push_str(&buf, user);
    expbuf_push_num(&buf, change_socket_ownership);
    if (expbuf_write(&buf, thdata->fd) != 0)
        dief(errno != 0 ? "write error" : "connection closed by daemon");
    expbuf_dispose(&buf);

    if (expbuf_read(&buf, thdata->fd) != 0)
        dief(errno != 0 ? "read error" : "connection closed by daemon");
    if (expbuf_shift_num(&buf, &ret) != 0) {
        errno = 0;
        dief("failed to parse response");
    }
    expbuf_dispose(&buf);

    return (int)ret;
}